

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O2

char * dfdToStringVendorID(khr_df_vendorid_e value)

{
  char *pcVar1;
  
  pcVar1 = (char *)0x0;
  if (value == KHR_DF_VENDORID_KHRONOS) {
    pcVar1 = "KHR_DF_VENDORID_KHRONOS";
  }
  return pcVar1;
}

Assistant:

const char* dfdToStringVendorID(khr_df_vendorid_e value) {
    switch (value) {
    case KHR_DF_VENDORID_KHRONOS:
        return "KHR_DF_VENDORID_KHRONOS";

    case KHR_DF_VENDORID_MAX:
        // These enum values are not meant for string representation. Ignore
        break;
    }
    return NULL;
}